

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src,bool before)

{
  const_iterator __position;
  pointer pcVar1;
  TargetPropertyEntryVector *pTVar2;
  cmake *propertyValue;
  undefined7 in_register_00000011;
  pointer *__ptr;
  undefined1 local_98 [8];
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *local_90;
  _Base_ptr local_88;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> local_80;
  _Base_ptr p_Stack_78;
  pointer local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *local_60;
  _Base_ptr local_58;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> local_50;
  _Base_ptr p_Stack_48;
  pointer local_40;
  _Alloc_hider _Stack_38;
  
  pTVar2 = (TargetPropertyEntryVector *)
           &(this->SourceEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)CONCAT71(in_register_00000011,before) != 0) {
    pTVar2 = &this->SourceEntries;
  }
  __position._M_current =
       (pTVar2->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propertyValue = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
  pcVar1 = (src->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  if (local_90 == &local_80) {
    p_Stack_48 = p_Stack_78;
    local_60 = &local_50;
  }
  else {
    local_60 = local_90;
  }
  local_50._M_t.
  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._1_7_ =
       local_80._M_t.
       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._1_7_;
  local_50._M_t.
  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._0_1_ =
       local_80._M_t.
       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._0_1_;
  local_58 = local_88;
  local_88 = (_Base_ptr)0x0;
  local_80._M_t.
  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl._0_1_ = 0;
  local_40 = local_70;
  _Stack_38._M_p = (pointer)p_Stack_68;
  local_70 = (pointer)0x0;
  p_Stack_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90 = &local_80;
  CreateTargetPropertyEntry
            ((cmake *)local_98,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,SUB81(&local_60,0));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->SourceEntries,__position,(value_type *)local_98);
  if (local_98 != (undefined1  [8])0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_98)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  local_98 = (undefined1  [8])0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_p);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,(ulong)((long)local_50._M_t.
                                           super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                           .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                           ._M_head_impl + 1));
  }
  if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80._M_t.
                                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                      _M_head_impl._1_7_,
                                      local_80._M_t.
                                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                      _M_head_impl._0_1_) + 1);
  }
  ClearSourcesCache(this);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src, bool before)
{
  this->SourceEntries.insert(
    before ? this->SourceEntries.begin() : this->SourceEntries.end(),
    CreateTargetPropertyEntry(
      *this->LocalGenerator->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
  this->ClearSourcesCache();
}